

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O0

vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *
xlfparser::tokenize<wchar_t>
          (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *__return_storage_ptr__,
          wchar_t *formula,size_t size,Options<wchar_t> *options)

{
  Type type_00;
  wchar_t *pwVar1;
  size_t sVar2;
  syntax_option_type __f;
  invalid_formula *piVar3;
  optional<wchar_t> *poVar4;
  wostream *pwVar5;
  reference pvVar6;
  __tuple_element_t<0UL,_tuple<Type,_Subtype>_> *p_Var7;
  __tuple_element_t<1UL,_tuple<Type,_Subtype>_> *p_Var8;
  reference this;
  size_t sVar9;
  bool bVar10;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> local_700;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> local_6e8;
  Token local_6d0;
  Token local_6b8;
  undefined1 local_69a;
  allocator<char> local_699;
  string local_698;
  Token local_678;
  Token local_660;
  undefined4 local_648;
  Subtype local_644 [3];
  tuple<xlfparser::Token::Type,_xlfparser::Token::Subtype> local_638;
  tuple<xlfparser::Token::Type,_xlfparser::Token::Subtype> type;
  value_type local_614;
  Token local_610;
  value_type local_5f4;
  Token local_5f0;
  Token local_5d8;
  Token local_5c0;
  wchar_t *local_5a8;
  wchar_t *op_2;
  Token local_588;
  wchar_t *local_570;
  wchar_t *op_1;
  undefined1 local_560 [7];
  bool foundOp;
  Token local_548;
  long *local_530;
  wchar_t **op;
  undefined1 local_520 [7];
  bool foundOp_1;
  Token local_508;
  Token local_4f0;
  Token local_4d8;
  undefined1 local_4ba;
  allocator<char> local_4b9;
  string local_4b8;
  Token local_498;
  value_type local_47c;
  Token local_478;
  Token local_460;
  Token local_448;
  value_type local_430 [2];
  Token local_428;
  Token local_410;
  Token local_3f8;
  Token local_3e0;
  Token local_3c8;
  Token local_3b0;
  Token local_398;
  wchar_t **local_380;
  wchar_t **err;
  size_t local_360;
  size_t start;
  size_t index;
  stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
  stack;
  bool in_error;
  bool in_range;
  bool in_path;
  wchar_t *pwStack_2f8;
  bool in_string;
  wchar_t *COMPARATORS_MULTI [4];
  wchar_t *ERRORS [9];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_288;
  undefined1 local_268 [8];
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> sn_regex;
  basic_stringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> sn_regex_ss;
  wostream local_238 [376];
  wchar_t *local_c0;
  wchar_t *OPERATORS_POSTFIX;
  wchar_t *OPERATORS_INFIX;
  wchar_t local_a8;
  wchar_t row_separator;
  wchar_t local_a0;
  wchar_t decimal_separator;
  wchar_t local_98;
  wchar_t list_separator;
  wchar_t local_90;
  wchar_t right_bracket;
  wchar_t local_88;
  wchar_t left_bracket;
  wchar_t local_80;
  wchar_t right_brace;
  undefined4 local_78;
  wchar_t left_brace;
  wchar_t ERROR_START;
  wchar_t WHITESPACE;
  wchar_t PAREN_CLOSE;
  wchar_t PAREN_OPEN;
  wchar_t QUOTE_SINGLE;
  wchar_t QUOTE_DOUBLE;
  allocator<char> local_49;
  string local_48;
  Options<wchar_t> *local_28;
  Options<wchar_t> *options_local;
  size_t size_local;
  wchar_t *formula_local;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *tokens;
  
  local_28 = options;
  options_local = (Options<wchar_t> *)size;
  size_local = (size_t)formula;
  formula_local = (wchar_t *)__return_storage_ptr__;
  if ((size < 2) || (*formula != L'=')) {
    QUOTE_SINGLE._3_1_ = 1;
    piVar3 = (invalid_formula *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Invalid Excel formula",&local_49);
    invalid_formula::invalid_formula(piVar3,&local_48);
    QUOTE_SINGLE._3_1_ = 0;
    __cxa_throw(piVar3,&invalid_formula::typeinfo,invalid_formula::~invalid_formula);
  }
  PAREN_OPEN = L'\"';
  PAREN_CLOSE = L'\'';
  WHITESPACE = L'(';
  ERROR_START = L')';
  left_brace = L' ';
  local_78 = 0x23;
  local_80 = _choose_char<wchar_t>('{',L'{');
  right_brace = std::optional<wchar_t>::value_or<wchar_t>(&options->left_brace,&local_80);
  poVar4 = &local_28->right_brace;
  local_88 = _choose_char<wchar_t>('}',L'}');
  left_bracket = std::optional<wchar_t>::value_or<wchar_t>(poVar4,&local_88);
  poVar4 = &local_28->left_bracket;
  local_90 = _choose_char<wchar_t>('[',L'[');
  right_bracket = std::optional<wchar_t>::value_or<wchar_t>(poVar4,&local_90);
  poVar4 = &local_28->right_brace;
  local_98 = _choose_char<wchar_t>(']',L']');
  list_separator = std::optional<wchar_t>::value_or<wchar_t>(poVar4,&local_98);
  poVar4 = &local_28->list_separator;
  local_a0 = _choose_char<wchar_t>(',',L',');
  decimal_separator = std::optional<wchar_t>::value_or<wchar_t>(poVar4,&local_a0);
  poVar4 = &local_28->decimal_separator;
  local_a8 = _choose_char<wchar_t>('.',L'.');
  row_separator = std::optional<wchar_t>::value_or<wchar_t>(poVar4,&local_a8);
  poVar4 = &local_28->row_separator;
  OPERATORS_INFIX._0_4_ = _choose_char<wchar_t>(';',L';');
  OPERATORS_INFIX._4_4_ =
       std::optional<wchar_t>::value_or<wchar_t>(poVar4,(wchar_t *)&OPERATORS_INFIX);
  OPERATORS_POSTFIX = _choose_string<wchar_t>("+-*/^&=><@",L"+-*/^&=><@");
  local_c0 = _choose_string<wchar_t>("%",L"%");
  std::__cxx11::wstringstream::wstringstream
            ((wstringstream *)
             &sn_regex._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  pwVar5 = std::operator<<(local_238,"^[1-9](\\");
  pwVar5 = std::operator<<(pwVar5,row_separator);
  std::operator<<(pwVar5,"\\d+)?E[+-]\\d*$");
  std::__cxx11::wstringstream::str();
  __f = Catch::clara::std::regex_constants::operator|(0x10,1);
  std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
  basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>
            ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)local_268,&local_288,__f);
  std::__cxx11::wstring::~wstring((wstring *)&local_288);
  COMPARATORS_MULTI[3] = L"#NULL!";
  COMPARATORS_MULTI[1] = L"<>";
  COMPARATORS_MULTI[2] = (wchar_t *)0x0;
  pwStack_2f8 = L">=";
  COMPARATORS_MULTI[0] = L"<=";
  stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node._7_1_ = 0;
  stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node._6_1_ = 0;
  stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node._5_1_ = 0;
  stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node._4_1_ = 0;
  stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node._3_1_ = 0;
  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::vector(__return_storage_ptr__);
  std::
  stack<xlfparser::Token::Type,std::deque<xlfparser::Token::Type,std::allocator<xlfparser::Token::Type>>>
  ::stack<std::deque<xlfparser::Token::Type,std::allocator<xlfparser::Token::Type>>,void>
            ((stack<xlfparser::Token::Type,std::deque<xlfparser::Token::Type,std::allocator<xlfparser::Token::Type>>>
              *)&index);
  start = 1;
  local_360 = 1;
LAB_001ef12d:
  do {
    bVar10 = false;
    if (start < options_local) {
      bVar10 = *(int *)(size_local + start * 4) != 0;
    }
    if (!bVar10) {
      if (local_360 < start) {
        bVar10 = std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::empty
                           (__return_storage_ptr__);
        if (!bVar10) {
          this = std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::back
                           (__return_storage_ptr__);
          sVar9 = Token::end(this);
          if (local_360 <= sVar9) goto LAB_001f055f;
        }
        Token::Token(&local_6d0,local_360,start - 1,Operand,None);
        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                  (__return_storage_ptr__,&local_6d0);
      }
LAB_001f055f:
      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::vector
                (&local_700,__return_storage_ptr__);
      _fix_whitespace_tokens<wchar_t>
                (&local_6e8,&local_700,(wchar_t *)size_local,(size_t)options_local);
      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::operator=
                (__return_storage_ptr__,&local_6e8);
      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::~vector(&local_6e8);
      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::~vector(&local_700);
      _infer_token_subtypes<wchar_t>
                (__return_storage_ptr__,local_28,(wchar_t *)size_local,(size_t)options_local);
      stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_node._3_1_ = 1;
      std::
      stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
      ::~stack((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                *)&index);
      if ((stack.c.
           super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_node._3_1_ & 1) == 0) {
        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::~vector
                  (__return_storage_ptr__);
      }
      std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex
                ((basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)local_268);
      std::__cxx11::wstringstream::~wstringstream
                ((wstringstream *)
                 &sn_regex._M_automaton.
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return __return_storage_ptr__;
    }
    if ((stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ & 1) != 0) {
      if (*(int *)(size_local + start * 4) == 0x22) {
        if ((options_local < (Options<wchar_t> *)(start + 2)) ||
           (*(int *)(size_local + 4 + start * 4) != 0x22)) {
          Token::Token((Token *)&err,local_360,start,Operand,Text);
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                    (__return_storage_ptr__,(value_type *)&err);
          local_360 = start + 1;
          stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ = 0;
          start = local_360;
        }
        else {
          start = start + 2;
        }
      }
      else {
        start = start + 1;
      }
      goto LAB_001ef12d;
    }
    if ((stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_node._6_1_ & 1) != 0) {
      if (*(int *)(size_local + start * 4) == 0x27) {
        if (((Options<wchar_t> *)(start + 2) <= options_local) &&
           (*(int *)(size_local + 4 + start * 4) == 0x27)) {
          start = start + 2;
          goto LAB_001ef12d;
        }
        stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_node._6_1_ = 0;
      }
      start = start + 1;
      goto LAB_001ef12d;
    }
    if ((stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_node._5_1_ & 1) == 0) {
      if ((stack.c.
           super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_node._4_1_ & 1) == 0) {
        if ((local_360 < start) &&
           (bVar10 = std::regex_match<wchar_t_const*,wchar_t,std::__cxx11::regex_traits<wchar_t>>
                               ((wchar_t *)(size_local + local_360 * 4),
                                (wchar_t *)(size_local + 4 + start * 4),
                                (basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)
                                local_268,0), bVar10)) {
          start = start + 1;
        }
        else if (*(int *)(size_local + start * 4) == 0x22) {
          if (local_360 < start) {
            Token::Token(&local_3b0,local_360,start - 1,Unknown,None);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_3b0);
            local_360 = start;
          }
          stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ = 1;
          start = start + 1;
        }
        else if (*(int *)(size_local + start * 4) == 0x27) {
          if (local_360 < start) {
            Token::Token(&local_3c8,local_360,start - 1,Unknown,None);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_3c8);
            local_360 = start;
          }
          stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node._6_1_ = 1;
          start = start + 1;
        }
        else if (*(wchar_t *)(size_local + start * 4) == right_bracket) {
          stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node._5_1_ = 1;
          start = start + 1;
        }
        else if (*(int *)(size_local + start * 4) == 0x23) {
          if (local_360 < start) {
            Token::Token(&local_3e0,local_360,start - 1,Unknown,None);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_3e0);
            local_360 = start;
          }
          stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node._4_1_ = 1;
          start = start + 1;
        }
        else if (*(wchar_t *)(size_local + start * 4) == right_brace) {
          if (local_360 < start) {
            Token::Token(&local_3f8,local_360,start - 1,Unknown,None);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_3f8);
            local_360 = start;
          }
          Token::Token(&local_410,local_360,start,Array,Start);
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                    (__return_storage_ptr__,&local_410);
          Token::Token(&local_428,local_360,start,ArrayRow,Start);
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                    (__return_storage_ptr__,&local_428);
          local_430[1] = 3;
          std::
          stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
          ::push((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                  *)&index,local_430 + 1);
          local_430[0] = ArrayRow;
          std::
          stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
          ::push((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                  *)&index,local_430);
          local_360 = start + 1;
          start = local_360;
        }
        else {
          if (((*(wchar_t *)(size_local + start * 4) == OPERATORS_INFIX._4_4_) &&
              (bVar10 = std::
                        stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                        ::empty((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                                 *)&index), !bVar10)) &&
             (pvVar6 = std::
                       stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                       ::top((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                              *)&index), *pvVar6 == ArrayRow)) {
            if (local_360 < start) {
              Token::Token(&local_448,local_360,start - 1,Operand,None);
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                        (__return_storage_ptr__,&local_448);
              local_360 = start;
            }
            sVar2 = start;
            sVar9 = local_360;
            pvVar6 = std::
                     stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                     ::top((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                            *)&index);
            Token::Token(&local_460,sVar9,sVar2,*pvVar6,Stop);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_460);
            std::
            stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
            ::pop((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                   *)&index);
            Token::Token(&local_478,local_360,start,ArrayRow,Start);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_478);
            local_47c = ArrayRow;
            std::
            stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
            ::push((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                    *)&index,&local_47c);
            local_360 = start + 1;
            start = local_360;
            goto LAB_001ef12d;
          }
          if (*(wchar_t *)(size_local + start * 4) != left_bracket) {
            if (*(int *)(size_local + start * 4) == 0x20) {
              if (local_360 < start) {
                Token::Token(&local_508,local_360,start - 1,Operand,None);
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                          (__return_storage_ptr__,&local_508);
                local_360 = start;
              }
              for (; *(int *)(size_local + start * 4) == 0x20 && start < options_local;
                  start = start + 1) {
              }
              Token::Token((Token *)local_520,local_360,start - 1,Whitespace,None);
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                        (__return_storage_ptr__,(value_type *)local_520);
              local_360 = start;
              goto LAB_001ef12d;
            }
            if ((Options<wchar_t> *)(start + 2) <= options_local) {
              op._7_1_ = 0;
              for (local_530 = (long *)&stack0xfffffffffffffd08; *local_530 != 0;
                  local_530 = local_530 + 1) {
                pwVar1 = (wchar_t *)*local_530;
                sVar9 = _tcslen(pwVar1);
                bVar10 = _str_equals(pwVar1,sVar9,(wchar_t *)(size_local + start * 4),2);
                if (bVar10) {
                  if (local_360 < start) {
                    Token::Token(&local_548,local_360,start - 1,Operand,None);
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                              (__return_storage_ptr__,&local_548);
                    local_360 = start;
                  }
                  Token::Token((Token *)local_560,local_360,start + 1,OperatorInfix,Logical);
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                            (__return_storage_ptr__,(value_type *)local_560);
                  op._7_1_ = 1;
                  break;
                }
              }
              if ((op._7_1_ & 1) != 0) {
                local_360 = start + 2;
                start = local_360;
                goto LAB_001ef12d;
              }
            }
            op_1._7_1_ = '\0';
            for (local_570 = OPERATORS_POSTFIX; *local_570 != L'\0'; local_570 = local_570 + 1) {
              if (*local_570 == *(wchar_t *)(size_local + start * 4)) {
                if (local_360 < start) {
                  Token::Token(&local_588,local_360,start - 1,Operand,None);
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                            (__return_storage_ptr__,&local_588);
                  local_360 = start;
                }
                Token::Token((Token *)&op_2,local_360,start,OperatorInfix,None);
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                          (__return_storage_ptr__,(value_type *)&op_2);
                op_1._7_1_ = '\x01';
                break;
              }
            }
            if (op_1._7_1_ == '\0') {
              for (local_5a8 = local_c0; *local_5a8 != L'\0'; local_5a8 = local_5a8 + 1) {
                if (*local_5a8 == *(wchar_t *)(size_local + start * 4)) {
                  if (local_360 < start) {
                    Token::Token(&local_5c0,local_360,start - 1,Operand,None);
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                              (__return_storage_ptr__,&local_5c0);
                    local_360 = start;
                  }
                  Token::Token(&local_5d8,local_360,start,OperatorPostfix,None);
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                            (__return_storage_ptr__,&local_5d8);
                  op_1._7_1_ = '\x01';
                  break;
                }
              }
              if (op_1._7_1_ == '\0') {
                if (*(int *)(size_local + start * 4) == 0x28) {
                  if (local_360 < start) {
                    Token::Token(&local_5f0,local_360,start - 1,Function,Start);
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                              (__return_storage_ptr__,&local_5f0);
                    local_5f4 = Function;
                    std::
                    stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                    ::push((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                            *)&index,&local_5f4);
                  }
                  else {
                    Token::Token(&local_610,local_360,start,Subexpression,Start);
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                              (__return_storage_ptr__,&local_610);
                    local_614 = Subexpression;
                    std::
                    stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                    ::push((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                            *)&index,&local_614);
                  }
                  local_360 = start + 1;
                  start = local_360;
                }
                else if (*(wchar_t *)(size_local + start * 4) == decimal_separator) {
                  if (local_360 < start) {
                    Token::Token((Token *)&type,local_360,start - 1,Operand,None);
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                              (__return_storage_ptr__,(value_type *)&type);
                    local_360 = start;
                  }
                  bVar10 = std::
                           stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                           ::empty((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                                    *)&index);
                  if ((bVar10) ||
                     (pvVar6 = std::
                               stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                               ::top((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                                      *)&index), *pvVar6 != Function)) {
                    local_644[0] = Math;
                    local_648 = 0xb;
                    std::make_tuple<xlfparser::Token::Type,xlfparser::Token::Subtype>
                              ((Type *)&local_638,local_644);
                  }
                  else {
                    local_644[2] = 6;
                    local_644[1] = 0;
                    std::make_tuple<xlfparser::Token::Type,xlfparser::Token::Subtype>
                              ((Type *)&local_638,local_644 + 2);
                  }
                  sVar2 = start;
                  sVar9 = local_360;
                  p_Var7 = std::get<0ul,xlfparser::Token::Type,xlfparser::Token::Subtype>
                                     (&local_638);
                  type_00 = *p_Var7;
                  p_Var8 = std::get<1ul,xlfparser::Token::Type,xlfparser::Token::Subtype>
                                     (&local_638);
                  Token::Token(&local_660,sVar9,sVar2,type_00,*p_Var8);
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                            (__return_storage_ptr__,&local_660);
                  local_360 = start + 1;
                  start = local_360;
                }
                else if (*(int *)(size_local + start * 4) == 0x29) {
                  if (local_360 < start) {
                    Token::Token(&local_678,local_360,start - 1,Operand,None);
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                              (__return_storage_ptr__,&local_678);
                    local_360 = start;
                  }
                  bVar10 = std::
                           stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                           ::empty((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                                    *)&index);
                  sVar2 = start;
                  sVar9 = local_360;
                  if (bVar10) {
                    local_69a = 1;
                    piVar3 = (invalid_formula *)__cxa_allocate_exception(0x10);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_698,"Mismatched parentheses",&local_699);
                    invalid_formula::invalid_formula(piVar3,&local_698);
                    local_69a = 0;
                    __cxa_throw(piVar3,&invalid_formula::typeinfo,invalid_formula::~invalid_formula)
                    ;
                  }
                  pvVar6 = std::
                           stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                           ::top((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                                  *)&index);
                  Token::Token(&local_6b8,sVar9,sVar2,*pvVar6,Stop);
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                            (__return_storage_ptr__,&local_6b8);
                  std::
                  stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                  ::pop((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                         *)&index);
                  local_360 = start + 1;
                  start = local_360;
                }
                else {
                  start = start + 1;
                }
              }
              else {
                local_360 = start + 1;
                start = local_360;
              }
            }
            else {
              local_360 = start + 1;
              start = local_360;
            }
            goto LAB_001ef12d;
          }
          if (local_360 < start) {
            Token::Token(&local_498,local_360,start - 1,Operand,None);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_498);
            local_360 = start;
          }
          bVar10 = std::
                   stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                   ::empty((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                            *)&index);
          sVar2 = start;
          sVar9 = local_360;
          if (bVar10) {
            local_4ba = 1;
            piVar3 = (invalid_formula *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4b8,"Mismatched braces",&local_4b9);
            invalid_formula::invalid_formula(piVar3,&local_4b8);
            local_4ba = 0;
            __cxa_throw(piVar3,&invalid_formula::typeinfo,invalid_formula::~invalid_formula);
          }
          pvVar6 = std::
                   stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                   ::top((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                          *)&index);
          Token::Token(&local_4d8,sVar9,sVar2,*pvVar6,Stop);
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                    (__return_storage_ptr__,&local_4d8);
          std::
          stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
          ::pop((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                 *)&index);
          sVar2 = start;
          sVar9 = local_360;
          pvVar6 = std::
                   stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                   ::top((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                          *)&index);
          Token::Token(&local_4f0,sVar9,sVar2,*pvVar6,Stop);
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                    (__return_storage_ptr__,&local_4f0);
          std::
          stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
          ::pop((stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
                 *)&index);
          local_360 = start + 1;
          start = local_360;
        }
      }
      else {
        for (local_380 = COMPARATORS_MULTI + 3; *local_380 != (wchar_t *)0x0;
            local_380 = local_380 + 1) {
          pwVar1 = *local_380;
          sVar9 = _tcslen(pwVar1);
          bVar10 = _str_equals(pwVar1,sVar9,(wchar_t *)(size_local + local_360 * 4),
                               (start - local_360) + 1);
          if (bVar10) {
            Token::Token(&local_398,local_360,start,Operand,Error);
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                      (__return_storage_ptr__,&local_398);
            local_360 = start + 1;
            stack.c.
            super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node._4_1_ = 0;
            break;
          }
        }
        start = start + 1;
      }
      goto LAB_001ef12d;
    }
    if (*(wchar_t *)(size_local + start * 4) == list_separator) {
      stack.c.super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_node._5_1_ = 0;
    }
    start = start + 1;
  } while( true );
}

Assistant:

inline std::vector<Token> tokenize(const char_type *formula, size_t size, const Options<char_type>& options)
    {
        // Basic checks to make sure it's a valid formula
        if (size < 2 || formula[0] != '=')
            throw invalid_formula("Invalid Excel formula");

        // Chars used in parsing excel formual
        const char_type QUOTE_DOUBLE  = XLFP_CHAR('"');
        const char_type QUOTE_SINGLE  = XLFP_CHAR('\'');
        const char_type PAREN_OPEN    = XLFP_CHAR('(');
        const char_type PAREN_CLOSE   = XLFP_CHAR(')');
        const char_type WHITESPACE    = XLFP_CHAR(' ');
        const char_type ERROR_START   = XLFP_CHAR('#');

        // Some chars can be changed in the options
        const auto left_brace = options.left_brace.value_or(XLFP_CHAR('{'));
        const auto right_brace = options.right_brace.value_or(XLFP_CHAR('}'));
        const auto left_bracket = options.left_bracket.value_or(XLFP_CHAR('['));
        const auto right_bracket = options.right_brace.value_or(XLFP_CHAR(']'));
        const auto list_separator = options.list_separator.value_or(XLFP_CHAR(','));
        const auto decimal_separator = options.decimal_separator.value_or(XLFP_CHAR('.'));
        const auto row_separator = options.row_separator.value_or(XLFP_CHAR(';'));

        const char_type* OPERATORS_INFIX   = XLFP_STRING("+-*/^&=><@");
        const char_type* OPERATORS_POSTFIX = XLFP_STRING("%");

        // This matches a number in scientific notation with or without numbers after the + or -.
        // It's used to test for SN numbers before checking for +/- operators.
        std::basic_stringstream<char_type> sn_regex_ss;
        sn_regex_ss << R"(^[1-9](\)" << decimal_separator << R"(\d+)?E[+-]\d*$)";
        const std::basic_regex<char_type> sn_regex(sn_regex_ss.str(),
            std::regex_constants::ECMAScript |
            std::regex_constants::icase);

        const char_type* ERRORS[] = {
                XLFP_STRING("#NULL!"),
                XLFP_STRING("#DIV/0!"),
                XLFP_STRING("#VALUE!"),
                XLFP_STRING("#REF!"),
                XLFP_STRING("#NAME?"),
                XLFP_STRING("#NUM!"),
                XLFP_STRING("#N/A"),
                XLFP_STRING("#SPILL!"),
                NULL
        };

        const char_type* COMPARATORS_MULTI[] = {
                XLFP_STRING(">="),
                XLFP_STRING("<="),
                XLFP_STRING("<>"),
                NULL
        };

        bool in_string = false;
        bool in_path = false;
        bool in_range = false;
        bool in_error = false;

        std::vector<Token> tokens;
        std::stack<Token::Type> stack;

        size_t index = 1;  // first char is always '='
        size_t start = index;  // start of the current token
        while(index < size && formula[index] != L'\0')
        {
            // state-dependent character evaluation (order is important)

            // double-quoted strings
            // embeds are doubled
            // end marks token
            if (in_string) {
                if (formula[index] == QUOTE_DOUBLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_DOUBLE))
                    {
                        // '""' is a quoted '"' so skip both
                        index += 2;
                        continue;
                    }

                    // add the string token, exit the string and continue
                    tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Text));
                    start = ++index;
                    in_string = false;
                    continue;
                }

                ++index;
                continue;
            }

            // single-quoted strings (links)
            // embeds are double
            // end does not mark a token
            if (in_path)
            {
                if (formula[index] == QUOTE_SINGLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_SINGLE))
                    {
                        // '' is a quoted ' so skip both
                        index += 2;
                        continue;
                    }

                    in_path = false;
                }

                ++index;
                continue;
            }

            // bracketed strings (R1C1 range index or linked workbook name)
            // no embeds (changed to "()" by Excel)
            // end does not mark a token
            if (in_range)
            {
                if (formula[index] == right_bracket)
                    in_range = false;

                index++;
                continue;
            }

            // error values
            // end marks a token, determined from absolute list of values
            if (in_error)
            {
                for (auto err = &ERRORS[0]; *err != NULL; ++err)
                {
                    if (_str_equals(*err, _tcslen(*err), &formula[start], 1 + index - start))
                    {
                        // add the string token, exit the string and continue
                        tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Error));
                        start = index + 1;
                        in_error = false;
                        break;
                    }
                }

                ++index;
                continue;
            }

            // scientific notation check
            if (index > start)
            {
                if (std::regex_match(&formula[start], &formula[index]+1, sn_regex))
                {
                    ++index;
                    continue;
                }
            }

            // independent character evaluation (order not important)
            // establish state-dependent character evaluations
            if (formula[index] == QUOTE_DOUBLE) {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_string = true;
                ++index;
                continue;
            }

            if (formula[index] == QUOTE_SINGLE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_path = true;
                ++index;
                continue;
            }

            if (formula[index] == left_bracket)
            {
                in_range = true;
                ++index;
                continue;
            }

            if (formula[index] == ERROR_START)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_error = true;
                ++index;
                continue;
            }

            // mark start and end of arrays and array rows
            if (formula[index] == left_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, Token::Type::Array, Token::Subtype::Start));
                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));

                stack.push(Token::Type::Array);
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == row_separator && !stack.empty() && stack.top() == Token::Type::ArrayRow)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == right_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched braces");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // trim white-space
            if (formula[index] == WHITESPACE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                while ((formula[index] == WHITESPACE) && (index < size))
                    index++;

                tokens.push_back(Token(start, index-1, Token::Type::Whitespace, Token::Subtype::None));

                start = index;
                continue;
            }

            // multi-character comparators
            if ((index + 2) <= size)
            {
                bool foundOp = false;
                for (auto op = &COMPARATORS_MULTI[0]; *op != NULL; ++op)
                {
                    if (_str_equals(*op, _tcslen(*op), &formula[index], 2))
                    {
                        if (index > start)
                        {
                            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                            start = index;
                        }

                        tokens.push_back(Token(start, index+1, Token::Type::OperatorInfix, Token::Subtype::Logical));
                        foundOp = true;
                        break;
                    }
                }

                if (foundOp)
                {
                    index += 2;
                    start = index;
                    continue;
                }
            }

            // standard infix operators
            bool foundOp = false;
            for (auto op = OPERATORS_INFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorInfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // standard postfix operators
            for (auto op = OPERATORS_POSTFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorPostfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // start subexpression or function
            if (formula[index] == PAREN_OPEN)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Function, Token::Subtype::Start));
                    stack.push(Token::Type::Function);
                }
                else
                {
                    tokens.push_back(Token(start, index, Token::Type::Subexpression, Token::Subtype::Start));
                    stack.push(Token::Type::Subexpression);
                }

                start = ++index;
                continue;
            }

            // function, subexpression, or array parameters, or operand unions
            if (formula[index] == list_separator)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                auto type = (!stack.empty() && stack.top() == Token::Type::Function)
                                ? std::make_tuple(Token::Type::Argument, Token::Subtype::None)
                                : std::make_tuple(Token::Type::OperatorInfix, Token::Subtype::Union);

                tokens.push_back(Token(start, index, std::get<0>(type), std::get<1>(type)));

                start = ++index;
                continue;
            }

            // stop subexpression
            if (formula[index] == PAREN_CLOSE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched parentheses");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // token accumulation
            ++index;
        }

        // dump remaining accumulation, if any
        if (index > start && (tokens.empty() || tokens.back().end() < start))
            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));

        // label intersection operators specified as whitespace correctly
        tokens = _fix_whitespace_tokens(tokens, formula, size);

        // set the token subtypes correctly
        _infer_token_subtypes(tokens, options, formula, size);

        return tokens;
    }